

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrCompositionLayerCylinderKHR *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  PFN_xrStructureTypeToString p_Var1;
  void *value_00;
  bool bVar2;
  XrInstance pXVar3;
  invalid_argument *piVar4;
  XrGeneratedDispatchTable *pXVar5;
  string type_prefix;
  string aspectratio_prefix;
  string centralangle_prefix;
  string radius_prefix;
  string pose_prefix;
  string subimage_prefix;
  string eyevisibility_prefix;
  string space_prefix;
  string layerflags_prefix;
  string next_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8;
  undefined1 local_6b8 [32];
  string local_698;
  undefined1 local_678 [32];
  string local_658;
  string local_638;
  ostringstream oss_space;
  uint auStack_600 [2];
  PFN_xrCreateSwapchain local_5f8;
  PFN_xrCreateActionSpace p_Stack_5f0;
  PFN_xrLocateSpace local_5e8;
  PFN_xrAcquireSwapchainImage p_Stack_5e0;
  ostringstream oss_radius;
  undefined8 local_490 [46];
  ostringstream oss_aspectRatio;
  undefined8 local_318 [46];
  ostringstream oss_centralAngle;
  undefined8 local_1a0 [46];
  
  PointerToHexString<XrCompositionLayerCylinderKHR>
            ((XrCompositionLayerCylinderKHR *)type_prefix._M_dataplus._M_p);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_space);
  std::__cxx11::string::~string((string *)&oss_space);
  std::__cxx11::string::append((char *)prefix);
  std::__cxx11::string::string((string *)&type_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&type_prefix);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    std::__cxx11::to_string((string *)&oss_space,value->type);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_space);
    std::__cxx11::string::~string((string *)&oss_space);
  }
  else {
    local_5e8 = (PFN_xrLocateSpace)0x0;
    p_Stack_5e0 = (PFN_xrAcquireSwapchainImage)0x0;
    local_5f8 = (PFN_xrCreateSwapchain)0x0;
    p_Stack_5f0 = (PFN_xrCreateActionSpace)0x0;
    auStack_600[0] = 0;
    auStack_600[1] = 0;
    _oss_space = (pointer)0x0;
    p_Var1 = gen_dispatch_table->StructureTypeToString;
    pXVar3 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var1)(pXVar3,value->type,(char *)&oss_space);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,(char (*) [64])&oss_space);
  }
  std::__cxx11::string::string((string *)&next_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&next_prefix);
  value_00 = value->next;
  std::__cxx11::string::string((string *)&local_638,(string *)&next_prefix);
  bVar2 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_638,contents);
  std::__cxx11::string::~string((string *)&local_638);
  if (!bVar2) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"Invalid Operation");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::string::string((string *)&layerflags_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&layerflags_prefix);
  std::__cxx11::to_string((string *)&oss_space,value->layerFlags);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[24],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [24])"XrCompositionLayerFlags",&layerflags_prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_space);
  std::__cxx11::string::~string((string *)&oss_space);
  std::__cxx11::string::string((string *)&space_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&space_prefix);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_space);
  *(uint *)((long)auStack_600 + *(long *)(_oss_space + -0x18)) =
       *(uint *)((long)auStack_600 + *(long *)(_oss_space + -0x18)) & 0xffffffb5 | 8;
  std::ostream::_M_insert<void_const*>(&oss_space);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[8],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [8])"XrSpace",&space_prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_radius);
  std::__cxx11::string::~string((string *)&oss_radius);
  std::__cxx11::string::string((string *)&eyevisibility_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&eyevisibility_prefix);
  std::__cxx11::to_string((string *)&oss_radius,value->eyeVisibility);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [16])"XrEyeVisibility",&eyevisibility_prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_radius);
  std::__cxx11::string::~string((string *)&oss_radius);
  std::__cxx11::string::string((string *)&subimage_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&subimage_prefix);
  std::__cxx11::string::string((string *)(local_678 + 0x20),(string *)&subimage_prefix);
  pXVar5 = (XrGeneratedDispatchTable *)local_678;
  std::__cxx11::string::string((string *)pXVar5,"XrSwapchainSubImage",(allocator *)&oss_radius);
  bVar2 = ApiDumpOutputXrStruct
                    (pXVar5,&value->subImage,(string *)(local_678 + 0x20),(string *)local_678,false,
                     contents);
  std::__cxx11::string::~string((string *)local_678);
  std::__cxx11::string::~string((string *)(local_678 + 0x20));
  if (!bVar2) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"Invalid Operation");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::string::string((string *)&pose_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&pose_prefix);
  std::__cxx11::string::string((string *)(local_6b8 + 0x20),(string *)&pose_prefix);
  pXVar5 = (XrGeneratedDispatchTable *)local_6b8;
  std::__cxx11::string::string((string *)pXVar5,"XrPosef",(allocator *)&oss_radius);
  bVar2 = ApiDumpOutputXrStruct
                    (pXVar5,&value->pose,(string *)(local_6b8 + 0x20),(string *)local_6b8,false,
                     contents);
  std::__cxx11::string::~string((string *)local_6b8);
  std::__cxx11::string::~string((string *)(local_6b8 + 0x20));
  if (bVar2) {
    std::__cxx11::string::string((string *)&radius_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&radius_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_radius);
    *(undefined8 *)((long)local_490 + *(long *)(_oss_radius + -0x18)) = 0x20;
    std::ostream::operator<<((ostream *)&oss_radius,value->radius);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [6])"float",&radius_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_centralAngle);
    std::__cxx11::string::~string((string *)&oss_centralAngle);
    std::__cxx11::string::string((string *)&centralangle_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&centralangle_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_centralAngle);
    *(undefined8 *)((long)local_1a0 + *(long *)(_oss_centralAngle + -0x18)) = 0x20;
    std::ostream::operator<<((ostream *)&oss_centralAngle,value->centralAngle);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [6])"float",&centralangle_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_aspectRatio
              );
    std::__cxx11::string::~string((string *)&oss_aspectRatio);
    std::__cxx11::string::string((string *)&aspectratio_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&aspectratio_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_aspectRatio);
    *(undefined8 *)((long)local_318 + *(long *)(_oss_aspectRatio + -0x18)) = 0x20;
    std::ostream::operator<<((ostream *)&oss_aspectRatio,value->aspectRatio);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [6])"float",&aspectratio_prefix,&local_6d8);
    std::__cxx11::string::~string((string *)&local_6d8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_aspectRatio);
    std::__cxx11::string::~string((string *)&aspectratio_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_centralAngle);
    std::__cxx11::string::~string((string *)&centralangle_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_radius);
    std::__cxx11::string::~string((string *)&radius_prefix);
    std::__cxx11::string::~string((string *)&pose_prefix);
    std::__cxx11::string::~string((string *)&subimage_prefix);
    std::__cxx11::string::~string((string *)&eyevisibility_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_space);
    std::__cxx11::string::~string((string *)&space_prefix);
    std::__cxx11::string::~string((string *)&layerflags_prefix);
    std::__cxx11::string::~string((string *)&next_prefix);
    std::__cxx11::string::~string((string *)&type_prefix);
    return true;
  }
  piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar4,"Invalid Operation");
  __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrCompositionLayerCylinderKHR* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string layerflags_prefix = prefix;
        layerflags_prefix += "layerFlags";
        contents.emplace_back("XrCompositionLayerFlags", layerflags_prefix, std::to_string(value->layerFlags));
        std::string space_prefix = prefix;
        space_prefix += "space";
        std::ostringstream oss_space;
        oss_space << std::hex << reinterpret_cast<const void*>(value->space);
        contents.emplace_back("XrSpace", space_prefix, oss_space.str());
        std::string eyevisibility_prefix = prefix;
        eyevisibility_prefix += "eyeVisibility";
        contents.emplace_back("XrEyeVisibility", eyevisibility_prefix, std::to_string(value->eyeVisibility));
        std::string subimage_prefix = prefix;
        subimage_prefix += "subImage";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->subImage, subimage_prefix, "XrSwapchainSubImage", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string pose_prefix = prefix;
        pose_prefix += "pose";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->pose, pose_prefix, "XrPosef", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string radius_prefix = prefix;
        radius_prefix += "radius";
        std::ostringstream oss_radius;
        oss_radius << std::setprecision(32) << (value->radius);
        contents.emplace_back("float", radius_prefix, oss_radius.str());
        std::string centralangle_prefix = prefix;
        centralangle_prefix += "centralAngle";
        std::ostringstream oss_centralAngle;
        oss_centralAngle << std::setprecision(32) << (value->centralAngle);
        contents.emplace_back("float", centralangle_prefix, oss_centralAngle.str());
        std::string aspectratio_prefix = prefix;
        aspectratio_prefix += "aspectRatio";
        std::ostringstream oss_aspectRatio;
        oss_aspectRatio << std::setprecision(32) << (value->aspectRatio);
        contents.emplace_back("float", aspectratio_prefix, oss_aspectRatio.str());
        return true;
    } catch(...) {
    }
    return false;
}